

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandBm2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  FILE *pErr;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  long lVar7;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk2;
  int fDelete2;
  int fDelete1;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  pErr = Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  iVar2 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar2 == -1) {
    iVar3 = Abc_NtkPrepareTwoNtks
                      (pErr,pNtk,argv + globalUtilOptind,argc - globalUtilOptind,&pNtk1,&pNtk2,
                       &fDelete1,&fDelete2);
    iVar6 = 1;
    iVar2 = 1;
    if (iVar3 != 0) {
      if ((pNtk1->vPis->nSize == pNtk2->vPis->nSize) && (pNtk1->vPos->nSize == pNtk2->vPos->nSize))
      {
        Abc_NtkPermute(pNtk2,1,1,0,(char *)0x0);
        Abc_NtkShortNames(pNtk2);
        pVVar5 = pNtk1->vCis;
        if (0 < pVVar5->nSize) {
          lVar7 = 0;
          do {
            pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
            pcVar4 = Abc_ObjNamePrefix(pAVar1,"N1:");
            Nm_ManDeleteIdName(pNtk1->pManName,pAVar1->Id);
            Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
            lVar7 = lVar7 + 1;
            pVVar5 = pNtk1->vCis;
          } while (lVar7 < pVVar5->nSize);
        }
        pVVar5 = pNtk1->vCos;
        if (0 < pVVar5->nSize) {
          lVar7 = 0;
          do {
            pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
            pcVar4 = Abc_ObjNamePrefix(pAVar1,"N1:");
            Nm_ManDeleteIdName(pNtk1->pManName,pAVar1->Id);
            Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
            lVar7 = lVar7 + 1;
            pVVar5 = pNtk1->vCos;
          } while (lVar7 < pVVar5->nSize);
        }
        pVVar5 = pNtk2->vCis;
        if (0 < pVVar5->nSize) {
          lVar7 = 0;
          do {
            pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
            pcVar4 = Abc_ObjNamePrefix(pAVar1,"N2:");
            Nm_ManDeleteIdName(pNtk2->pManName,pAVar1->Id);
            Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
            lVar7 = lVar7 + 1;
            pVVar5 = pNtk2->vCis;
          } while (lVar7 < pVVar5->nSize);
        }
        pVVar5 = pNtk2->vCos;
        if (0 < pVVar5->nSize) {
          lVar7 = 0;
          do {
            pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
            pcVar4 = Abc_ObjNamePrefix(pAVar1,"N2:");
            Nm_ManDeleteIdName(pNtk2->pManName,pAVar1->Id);
            Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
            lVar7 = lVar7 + 1;
            pVVar5 = pNtk2->vCos;
          } while (lVar7 < pVVar5->nSize);
        }
        Abc_NtkAppend(pNtk1,pNtk2,1);
        iVar6 = 0;
        iVar2 = 0;
        saucyGateWay(pNtk1,(Abc_Obj_t *)0x0,(FILE *)0x0,1,0,0,0,0,0);
      }
      else {
        Abc_Print(-2,"Mismatch in the number of inputs or outputs\n");
        Abc_Print(-2,"*** Networks are NOT equivalent ***\n");
        iVar2 = 1;
      }
      if (fDelete1 != 0) {
        Abc_NtkDelete(pNtk1);
        iVar2 = iVar6;
      }
      if (fDelete2 != 0) {
        Abc_NtkDelete(pNtk2);
      }
    }
  }
  else {
    if (iVar2 != 0x68) {
      Abc_Print(-2,"Unknown switch.\n");
    }
    Abc_Print(-2,"usage: bm2  <file1> <file2>\n");
    Abc_Print(-2,"\t        performs Boolean matching (PP-equivalence)\n");
    Abc_Print(-2,"\t        for equivalent circuits, permutation that maps one circuit\n");
    Abc_Print(-2,"\t        to another is printed to standard output (PIs and POs of the\n");
    Abc_Print(-2,"\t        first network have prefix \"N1:\", while PIs and POs of the\n");
    Abc_Print(-2,"\t        second network have prefix \"N2:\")\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    Abc_Print(-2,"\tfile1 : the file with the first network\n");
    Abc_Print(-2,"\tfile2 : the file with the second network\n");
    Abc_Print(-2,"\t        \n");
    Abc_Print(-2,"\t        This command was contributed by Hadi Katebi from U Michigan.\n");
    Abc_Print(-2,"\t        The paper describing the method: H. Katebi, K. Sakallah and\n");
    Abc_Print(-2,"\t        I. L. Markov.\n");
    Abc_Print(-2,"\t        \"Generalized Boolean Symmetries Through Nested Partition\n");
    Abc_Print(-2,"\t        Refinement\". Proc. ICCAD 2013. \n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Abc_CommandBm2( Abc_Frame_t * pAbc, int argc, char ** argv )
{   
    FILE * pOut, * pErr;
    Abc_Ntk_t *pNtk, *pNtk1, *pNtk2;
    int fDelete1, fDelete2; 
    Abc_Obj_t * pObj;
    char ** pArgvNew;
    int c, nArgcNew, i; 

    extern void saucyGateWay( Abc_Ntk_t * pNtk, Abc_Obj_t * pNodePo, FILE * gFile, int fBooleanMatching,
                              int fLookForSwaps, int fFixOutputs, int fFixInputs, int fQuiet, int fPrintTree);

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);  
    
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;        
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( pErr, pNtk, pArgvNew, nArgcNew , &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;
        
    if( (unsigned)Abc_NtkPiNum(pNtk1) != (unsigned)Abc_NtkPiNum(pNtk2) || 
        (unsigned)Abc_NtkPoNum(pNtk1) != (unsigned)Abc_NtkPoNum(pNtk2) )
    {
        Abc_Print( -2, "Mismatch in the number of inputs or outputs\n");
        Abc_Print( -2, "*** Networks are NOT equivalent ***\n");
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
        return 1;
    }
    
    Abc_NtkPermute(pNtk2, 1, 1, 0, NULL );
    Abc_NtkShortNames(pNtk2);

    Abc_NtkForEachCi( pNtk1, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N1:" );
        Nm_ManDeleteIdName( pNtk1->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }
    Abc_NtkForEachCo( pNtk1, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N1:" );
        Nm_ManDeleteIdName( pNtk1->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }

    Abc_NtkForEachCi( pNtk2, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N2:" );
        Nm_ManDeleteIdName( pNtk2->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }
    Abc_NtkForEachCo( pNtk2, pObj, i ) {
        char * newName = Abc_ObjNamePrefix( pObj, "N2:" );
        Nm_ManDeleteIdName( pNtk2->pManName, pObj->Id);
        Abc_ObjAssignName( pObj, newName, NULL );
    }

    Abc_NtkAppend( pNtk1, pNtk2, 1 );
    saucyGateWay( pNtk1, NULL, NULL, 1, 0, 0, 0, 0, 0);

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );     
    return 0;

usage:
    Abc_Print( -2, "usage: bm2  <file1> <file2>\n" );
    Abc_Print( -2, "\t        performs Boolean matching (PP-equivalence)\n" );
    Abc_Print( -2, "\t        for equivalent circuits, permutation that maps one circuit\n" );
    Abc_Print( -2, "\t        to another is printed to standard output (PIs and POs of the\n" );
    Abc_Print( -2, "\t        first network have prefix \"N1:\", while PIs and POs of the\n" ); 
    Abc_Print( -2, "\t        second network have prefix \"N2:\")\n" ); 
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tfile1 : the file with the first network\n");
    Abc_Print( -2, "\tfile2 : the file with the second network\n");

    Abc_Print( -2, "\t        \n" );
    Abc_Print( -2, "\t        This command was contributed by Hadi Katebi from U Michigan.\n" );
    Abc_Print( -2, "\t        The paper describing the method: H. Katebi, K. Sakallah and\n");
    Abc_Print( -2, "\t        I. L. Markov.\n" );
    Abc_Print( -2, "\t        \"Generalized Boolean Symmetries Through Nested Partition\n");
    Abc_Print( -2, "\t        Refinement\". Proc. ICCAD 2013. \n" );
    //Abc_Print( -2, "\t        http://www.eecs.umich.edu/~imarkov/pubs/conf/date10-match.pdf\n" );
//    Abc_Print( -2, "\t        \n" );

    return 1;
}